

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessSamplersTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::Samplers::FunctionalTest::prepareSampler(FunctionalTest *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 1000))(1,&this->m_so);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glCreateTransformFeedbacks have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                  ,0x31d);
  (**(code **)(lVar3 + 0xa8))(0,this->m_so);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindSampler have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                  ,800);
  (**(code **)(lVar3 + 0x1280))(this->m_so,0x2802,0x2901);
  (**(code **)(lVar3 + 0x1280))(this->m_so,0x2803,0x2901);
  (**(code **)(lVar3 + 0x1280))(this->m_so,0x2801,0x2600);
  (**(code **)(lVar3 + 0x1280))(this->m_so,0x2800,0x2600);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glSamplerParameteri have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                  ,0x326);
  return;
}

Assistant:

void FunctionalTest::prepareSampler()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Sampler creation and setup. */
	gl.createSamplers(1, &m_so);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTransformFeedbacks have failed");

	gl.bindSampler(0, m_so);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindSampler have failed");

	gl.samplerParameteri(m_so, GL_TEXTURE_WRAP_S, GL_REPEAT);
	gl.samplerParameteri(m_so, GL_TEXTURE_WRAP_T, GL_REPEAT);
	gl.samplerParameteri(m_so, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	gl.samplerParameteri(m_so, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glSamplerParameteri have failed");
}